

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O2

ssize_t ws_client_collect(uchar *buf,size_t buflen,int frame_age,int frame_flags,
                         curl_off_t payload_offset,curl_off_t payload_len,void *userp,CURLcode *err)

{
  long lVar1;
  ulong uVar2;
  curl_trc_feat *pcVar3;
  CURLcode CVar4;
  Curl_easy *data;
  size_t __n;
  size_t bytes;
  
  data = *userp;
  lVar1 = *(long *)((long)userp + 0x18);
  uVar2 = *(ulong *)&(data->set).field_0x89c;
  if (lVar1 == 0) {
    *(int *)((long)userp + 0x20) = frame_age;
    *(int *)((long)userp + 0x24) = frame_flags;
    *(curl_off_t *)((long)userp + 0x28) = payload_offset;
    *(curl_off_t *)((long)userp + 0x30) = payload_len;
  }
  if (((uVar2 >> 0x38 & 1) == 0) &&
     (payload_offset + buflen == payload_len && (frame_flags & 0x10U) != 0)) {
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))) {
      Curl_infof(data,"WS: auto-respond to PING with a PONG");
      data = *userp;
    }
    CVar4 = curl_ws_send(data,buf,buflen,&bytes,0,0x40);
    *err = CVar4;
    return -(ulong)(CVar4 != CURLE_OK) | bytes;
  }
  *(undefined1 *)((long)userp + 0x38) = 1;
  __n = *(long *)((long)userp + 0x10) - lVar1;
  if (buflen <= __n) {
    __n = buflen;
  }
  if (__n == 0) {
    if (buflen == 0) {
      *err = CURLE_OK;
      __n = 0;
    }
    else {
      *err = CURLE_AGAIN;
      __n = 0xffffffffffffffff;
    }
  }
  else {
    *err = CURLE_OK;
    memcpy((void *)(lVar1 + *(long *)((long)userp + 8)),buf,__n);
    *(long *)((long)userp + 0x18) = *(long *)((long)userp + 0x18) + __n;
  }
  return __n;
}

Assistant:

static ssize_t ws_client_collect(const unsigned char *buf, size_t buflen,
                                 int frame_age, int frame_flags,
                                 curl_off_t payload_offset,
                                 curl_off_t payload_len,
                                 void *userp,
                                 CURLcode *err)
{
  struct ws_collect *ctx = userp;
  struct Curl_easy *data = ctx->data;
  bool auto_pong = !data->set.ws_no_auto_pong;
  size_t nwritten;
  curl_off_t remain = (payload_len - (payload_offset + buflen));

  if(!ctx->bufidx) {
    /* first write */
    ctx->frame_age = frame_age;
    ctx->frame_flags = frame_flags;
    ctx->payload_offset = payload_offset;
    ctx->payload_len = payload_len;
  }

  if(auto_pong && (frame_flags & CURLWS_PING) && !remain) {
    /* auto-respond to PINGs, only works for single-frame payloads atm */
    size_t bytes;
    infof(ctx->data, "WS: auto-respond to PING with a PONG");
    /* send back the exact same content as a PONG */
    *err = curl_ws_send(ctx->data, buf, buflen, &bytes, 0, CURLWS_PONG);
    if(*err)
      return -1;
    nwritten = bytes;
  }
  else {
    ctx->written = TRUE;
    DEBUGASSERT(ctx->buflen >= ctx->bufidx);
    nwritten = CURLMIN(buflen, ctx->buflen - ctx->bufidx);
    if(!nwritten) {
      if(!buflen) {  /* 0 length write, we accept that */
        *err = CURLE_OK;
        return 0;
      }
      *err = CURLE_AGAIN;  /* no more space */
      return -1;
    }
    *err = CURLE_OK;
    memcpy(ctx->buffer + ctx->bufidx, buf, nwritten);
    ctx->bufidx += nwritten;
  }
  return nwritten;
}